

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O0

bool __thiscall AllDiffBoundsImp<4>::propagate(AllDiffBoundsImp<4> *this)

{
  bool bVar1;
  int iVar2;
  BoolView *in_RDI;
  AllDiffBoundsImp<4> *in_stack_00000020;
  AllDiffBoundsImp<4> *in_stack_00000098;
  bool local_1;
  
  bVar1 = BoolView::isFixed((BoolView *)0x1a82cb);
  if ((bVar1) && (bVar1 = BoolView::isFalse(in_RDI), bVar1)) {
    local_1 = true;
  }
  else {
    sortit(in_stack_00000020);
    bVar1 = filterlower(in_stack_00000098);
    if (bVar1) {
      bVar1 = BoolView::isFixed((BoolView *)0x1a8315);
      if ((bVar1) && (bVar1 = BoolView::isFalse(in_RDI), bVar1)) {
        local_1 = true;
      }
      else {
        iVar2 = filterupper(in_stack_00000098);
        local_1 = iVar2 != 0;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool propagate() override {
		if (b.isFixed() && b.isFalse()) {
			return true;
		}
		sortit();
		if (!filterlower()) {
			return false;
		}
		if (b.isFixed() && b.isFalse()) {
			return true;
		}
		return filterupper();
	}